

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.hpp
# Opt level: O0

State * __thiscall
Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>>::
update<KalmanExamples::Robot1::PositionMeasurement<float>,Kalman::StandardBase>
          (UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>> *this,
          MeasurementModelType<KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
          *m,PositionMeasurement<float> *z)

{
  Covariance<KalmanExamples::Robot1::PositionMeasurement<float>_> *noiseCov;
  State *pSVar1;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<float,_2,_1,_0,_2,_1>_>
  local_c8;
  Product<Eigen::Matrix<float,_3,_2,_0,_3,_2>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_0>
  local_b0;
  undefined1 local_90 [8];
  KalmanGain<KalmanExamples::Robot1::PositionMeasurement<float>_> K;
  Covariance<KalmanExamples::Robot1::PositionMeasurement<float>_> P_yy;
  undefined1 local_60 [8];
  PositionMeasurement<float> y;
  SigmaPoints<KalmanExamples::Robot1::PositionMeasurement<float>_> sigmaMeasurementPoints;
  PositionMeasurement<float> *z_local;
  MeasurementModelType<KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
  *m_local;
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *this_local;
  
  Eigen::Matrix<float,_2,_7,_0,_2,_7>::Matrix((Matrix<float,_2,_7,_0,_2,_7> *)&y);
  UnscentedKalmanFilterBase<KalmanExamples::Robot1::State<float>_>::
  computeMeasurementPrediction<KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
            ((UnscentedKalmanFilterBase<KalmanExamples::Robot1::State<float>_> *)local_60,
             (MeasurementModelType<KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
              *)this,(SigmaPoints<KalmanExamples::Robot1::PositionMeasurement<float>_> *)m);
  Eigen::Matrix<float,_2,_2,_0,_2,_2>::Matrix
            ((Matrix<float,_2,_2,_0,_2,_2> *)
             (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array +
             4));
  noiseCov = StandardBase<KalmanExamples::Robot1::PositionMeasurement<float>_>::getCovariance
                       (&m->super_StandardBase<KalmanExamples::Robot1::PositionMeasurement<float>_>)
  ;
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::
  computeCovarianceFromSigmaPoints<KalmanExamples::Robot1::PositionMeasurement<float>_>
            ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)this,
             (PositionMeasurement<float> *)local_60,
             (SigmaPoints<KalmanExamples::Robot1::PositionMeasurement<float>_> *)&y,noiseCov,
             (Covariance<KalmanExamples::Robot1::PositionMeasurement<float>_> *)
             (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array +
             4));
  Eigen::Matrix<float,_3,_2,_0,_3,_2>::Matrix((Matrix<float,_3,_2,_0,_3,_2> *)local_90);
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::
  computeKalmanGain<KalmanExamples::Robot1::PositionMeasurement<float>_>
            ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)this,
             (PositionMeasurement<float> *)local_60,
             (SigmaPoints<KalmanExamples::Robot1::PositionMeasurement<float>_> *)&y,
             (Covariance<KalmanExamples::Robot1::PositionMeasurement<float>_> *)
             (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array +
             4),(KalmanGain<KalmanExamples::Robot1::PositionMeasurement<float>_> *)local_90);
  Eigen::MatrixBase<Eigen::Matrix<float,2,1,0,2,1>>::operator-
            (&local_c8,(MatrixBase<Eigen::Matrix<float,2,1,0,2,1>> *)z,
             (MatrixBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)local_60);
  Eigen::MatrixBase<Eigen::Matrix<float,3,2,0,3,2>>::operator*
            (&local_b0,(MatrixBase<Eigen::Matrix<float,3,2,0,3,2>> *)local_90,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
              *)&local_c8);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)this,
             (MatrixBase<Eigen::Product<Eigen::Matrix<float,_3,_2,_0,_3,_2>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_0>_>
              *)&local_b0);
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::
  updateStateCovariance<KalmanExamples::Robot1::PositionMeasurement<float>_>
            ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)this,
             (KalmanGain<KalmanExamples::Robot1::PositionMeasurement<float>_> *)local_90,
             (Covariance<KalmanExamples::Robot1::PositionMeasurement<float>_> *)
             (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array +
             4));
  pSVar1 = KalmanFilterBase<KalmanExamples::Robot1::State<float>_>::getState
                     ((KalmanFilterBase<KalmanExamples::Robot1::State<float>_> *)this);
  return pSVar1;
}

Assistant:

const State& update( const MeasurementModelType<Measurement, CovarianceBase>& m, const Measurement& z )
        {
            SigmaPoints<Measurement> sigmaMeasurementPoints;
            
            // Predict measurement (and corresponding sigma points)
            Measurement y = this->template computeMeasurementPrediction<Measurement, CovarianceBase>(m, sigmaMeasurementPoints);
            
            // Compute innovation covariance
            Covariance<Measurement> P_yy;
            computeCovarianceFromSigmaPoints(y, sigmaMeasurementPoints, m.getCovariance(), P_yy);
            
            KalmanGain<Measurement> K;
            computeKalmanGain(y, sigmaMeasurementPoints, P_yy, K);
            
            // Update state
            x += K * ( z - y );
            
            // Update state covariance
            updateStateCovariance<Measurement>(K, P_yy);
            
            return this->getState();
        }